

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O2

void Int8_To_Int32(void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride
                  ,uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  PaInt32 *dest;
  bool bVar1;
  
  while (bVar1 = count != 0, count = count - 1, bVar1) {
    *(uint *)destinationBuffer = (uint)*sourceBuffer << 0x18;
    sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride);
    destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride * 4);
  }
  return;
}

Assistant:

static void Int8_To_Int32(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    signed char *src = (signed char*)sourceBuffer;
    PaInt32 *dest =  (PaInt32*)destinationBuffer;
    (void)ditherGenerator; /* unused parameter */

    while( count-- )
    {
		(*dest) = (*src) << 24;

        src += sourceStride;
        dest += destinationStride;
    }
}